

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.h
# Opt level: O2

void __thiscall
slang::ast::NetAliasSymbol::visitExprs<no_dot_var_in_port_connection::MainVisitor&>
          (NetAliasSymbol *this,AlwaysFFVisitor *visitor)

{
  long lVar1;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> sVar2;
  
  sVar2 = getNetReferences(this);
  for (lVar1 = 0; sVar2._M_extent._M_extent_value._M_extent_value << 3 != lVar1; lVar1 = lVar1 + 8)
  {
    Expression::visit<no_dot_var_in_port_connection::MainVisitor&>
              (*(Expression **)((long)sVar2._M_ptr + lVar1),visitor);
  }
  return;
}

Assistant:

decltype(auto) visitExprs(TVisitor&& visitor) const {
        for (auto expr : getNetReferences())
            expr->visit(visitor);
    }